

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall randomx::Instruction::h_FDIV_M(Instruction *this,ostream *os)

{
  ostream oVar1;
  ostream *poVar2;
  ostream *in_RSI;
  ostream *in_RDI;
  Instruction *unaff_retaddr;
  int srcIndex;
  int dstIndex;
  
  oVar1 = in_RDI[1];
  poVar2 = std::operator<<(in_RSI,"e");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(byte)oVar1 % 4);
  std::operator<<(poVar2,", ");
  genAddressReg(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20));
  std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Instruction::h_FDIV_M(std::ostream& os) const {
		auto dstIndex = dst % RegisterCountFlt;
		auto srcIndex = src % RegistersCount;
		os << "e" << dstIndex << ", ";
		genAddressReg(os, srcIndex);
		os << std::endl;
	}